

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O2

Result * validateWeightParamsUpdatable(Result *__return_storage_ptr__,NeuralNetworkLayer *layer)

{
  QuantizationParams *pQVar1;
  ConvolutionLayerParams *pCVar2;
  WeightParams *pWVar3;
  InnerProductLayerParams *pIVar4;
  WeightParams **ppWVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  byte bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Result r;
  
  CoreML::Result::Result(&r);
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  if (layer->_oneof_case_[0] == 0x8c) {
    pIVar4 = CoreML::Specification::NeuralNetworkLayer::innerproduct(layer);
    bVar7 = pIVar4->hasbias_;
    if ((bool)bVar7 == true) {
      pIVar4 = CoreML::Specification::NeuralNetworkLayer::innerproduct(layer);
      pWVar3 = pIVar4->bias_;
      if (pWVar3 == (WeightParams *)0x0) {
        pWVar3 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
      }
      bVar9 = pWVar3->isupdatable_;
      pIVar4 = CoreML::Specification::NeuralNetworkLayer::innerproduct(layer);
      pWVar3 = pIVar4->bias_;
      if (pWVar3 == (WeightParams *)0x0) {
        pWVar3 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
      }
      bVar8 = pWVar3->quantization_ != (QuantizationParams *)0x0 &&
              pWVar3 != (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
    }
    else {
      bVar9 = 0;
      bVar8 = false;
    }
    pIVar4 = CoreML::Specification::NeuralNetworkLayer::innerproduct(layer);
    pWVar3 = pIVar4->weights_;
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
    }
    pQVar1 = pWVar3->quantization_;
    pIVar4 = CoreML::Specification::NeuralNetworkLayer::innerproduct(layer);
    bVar6 = pQVar1 != (QuantizationParams *)0x0 &&
            pWVar3 != (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
    ppWVar5 = &pIVar4->weights_;
LAB_00565028:
    if ((bVar6) || (bVar8)) {
      std::operator+(&local_b8,"An updatable layer, named \'",(layer->name_).ptr_);
      std::operator+(&local_78,&local_b8,
                     "\', has quantized weights/bias param. Quantized weights/bias not supported for update."
                    );
    }
    else {
      pWVar3 = *ppWVar5;
      if (pWVar3 == (WeightParams *)0x0) {
        pWVar3 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
      }
      if (((byte)(bVar9 | bVar7 ^ 1) == 1) && (pWVar3->isupdatable_ != false)) goto LAB_00565053;
      std::operator+(&local_b8,"An updatable layer, named \'",(layer->name_).ptr_);
      std::operator+(&local_78,&local_b8,
                     "\', has a weight/bias param which is not marked as updatable.");
    }
    std::__cxx11::string::operator=((string *)&err,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_b8);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_PARAMETERS,&err);
  }
  else {
    if (layer->_oneof_case_[0] == 100) {
      pCVar2 = CoreML::Specification::NeuralNetworkLayer::convolution(layer);
      bVar7 = pCVar2->hasbias_;
      if ((bool)bVar7 == true) {
        pCVar2 = CoreML::Specification::NeuralNetworkLayer::convolution(layer);
        pWVar3 = pCVar2->bias_;
        if (pWVar3 == (WeightParams *)0x0) {
          pWVar3 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
        }
        bVar9 = pWVar3->isupdatable_;
        pCVar2 = CoreML::Specification::NeuralNetworkLayer::convolution(layer);
        pWVar3 = pCVar2->bias_;
        if (pWVar3 == (WeightParams *)0x0) {
          pWVar3 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
        }
        bVar8 = pWVar3->quantization_ != (QuantizationParams *)0x0 &&
                pWVar3 != (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
      }
      else {
        bVar9 = 0;
        bVar8 = false;
      }
      pCVar2 = CoreML::Specification::NeuralNetworkLayer::convolution(layer);
      pWVar3 = pCVar2->weights_;
      if (pWVar3 == (WeightParams *)0x0) {
        pWVar3 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
      }
      pQVar1 = pWVar3->quantization_;
      pCVar2 = CoreML::Specification::NeuralNetworkLayer::convolution(layer);
      bVar6 = pQVar1 != (QuantizationParams *)0x0 &&
              pWVar3 != (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
      ppWVar5 = &pCVar2->weights_;
      goto LAB_00565028;
    }
LAB_00565053:
    CoreML::Result::Result(__return_storage_ptr__,&r);
  }
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

static Result validateWeightParamsUpdatable(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    
    bool weight_update_flag = false;
    bool bias_update_flag = false;
    bool has_bias = false;
    bool weights_are_quantized = false;
    bool bias_is_quantized = false;
    
    std::string err;
    
    switch (layer.layer_case()) {
        case Specification::NeuralNetworkLayer::kConvolution:
            has_bias = layer.convolution().hasbias();
            if (has_bias) {
                bias_update_flag = layer.convolution().bias().isupdatable();
                bias_is_quantized = layer.convolution().bias().has_quantization();
            }
            weights_are_quantized = layer.convolution().weights().has_quantization();
            weight_update_flag = layer.convolution().weights().isupdatable();
            break;
        case Specification::NeuralNetworkLayer::kInnerProduct:
            has_bias = layer.innerproduct().hasbias();
            if (has_bias) {
                bias_update_flag = layer.innerproduct().bias().isupdatable();
                bias_is_quantized = layer.innerproduct().bias().has_quantization();
            }
            weights_are_quantized = layer.innerproduct().weights().has_quantization();
            weight_update_flag = layer.innerproduct().weights().isupdatable();
            break;
        default:
            return r;
    }

    if (weights_are_quantized || bias_is_quantized) {
        err = "An updatable layer, named '" + layer.name() + "', has quantized weights/bias param. Quantized weights/bias not supported for update.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
    }
    
    if (!weight_update_flag || ((has_bias) && (!bias_update_flag))) {
        err = "An updatable layer, named '" + layer.name() + "', has a weight/bias param which is not marked as updatable.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_PARAMETERS, err);
    }
    
    return r;
}